

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QGraphicsWidget * __thiscall QGraphicsItem::topLevelWidget(QGraphicsItem *this)

{
  QGraphicsWidget *pQVar1;
  QGraphicsItem *this_00;
  
  do {
    this_00 = this;
    pQVar1 = parentWidget(this_00);
    this = &(pQVar1->super_QGraphicsObject).super_QGraphicsItem;
  } while (pQVar1 != (QGraphicsWidget *)0x0);
  return (QGraphicsWidget *)
         ((ulong)(this_00 + -1) & (*(long *)&((this_00->d_ptr).d)->field_0x160 << 0x27) >> 0x3f);
}

Assistant:

QGraphicsWidget *QGraphicsItem::topLevelWidget() const
{
    if (const QGraphicsWidget *p = parentWidget())
        return p->topLevelWidget();
    return isWidget() ? static_cast<QGraphicsWidget *>(const_cast<QGraphicsItem *>(this)) : nullptr;
}